

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

Var BailOutRecord::BailOutCommonNoCodeGen
              (JavascriptCallStackLayout *layout,BailOutRecord *bailOutRecord,uint32 bailOutOffset,
              void *returnAddress,BailOutKind bailOutKind,Var branchValue,Var *registerSaves,
              BailOutReturnValue *bailOutReturnValue,void *argoutRestoreAddress)

{
  code *pcVar1;
  Type functionRef_00;
  bool bVar2;
  undefined4 *puVar3;
  Var *pArgumentsObject;
  Var pvVar4;
  Var result;
  ArgumentReader args;
  ScriptFunction **functionRef;
  Var branchValue_local;
  BailOutKind bailOutKind_local;
  void *returnAddress_local;
  uint32 bailOutOffset_local;
  BailOutRecord *bailOutRecord_local;
  JavascriptCallStackLayout *layout_local;
  
  if (bailOutRecord->parent != (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x47d,"(bailOutRecord->parent == nullptr)",
                       "bailOutRecord->parent == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Js::VarIs<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)layout);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x47e,"(Js::VarIs<Js::ScriptFunction>(layout->functionObject))",
                       "Js::VarIs<Js::ScriptFunction>(layout->functionObject)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  args.super_Arguments.Values = (Type)layout;
  Js::ArgumentReader::ArgumentReader
            ((ArgumentReader *)&result,(CallInfo *)(layout + 8),(Var *)(layout + 0x10));
  functionRef_00 = args.super_Arguments.Values;
  pArgumentsObject = Js::JavascriptCallStackLayout::GetArgumentsObjectLocation(layout);
  pvVar4 = BailOutHelper(layout,(ScriptFunction **)functionRef_00,(Arguments *)&result,false,
                         bailOutRecord,bailOutOffset,returnAddress,bailOutKind,registerSaves,
                         bailOutReturnValue,pArgumentsObject,branchValue,argoutRestoreAddress);
  return pvVar4;
}

Assistant:

Js::Var
BailOutRecord::BailOutCommonNoCodeGen(Js::JavascriptCallStackLayout * layout, BailOutRecord const * bailOutRecord,
    uint32 bailOutOffset, void * returnAddress, IR::BailOutKind bailOutKind, Js::Var branchValue, Js::Var * registerSaves,
    BailOutReturnValue * bailOutReturnValue, void * argoutRestoreAddress)
{
    Assert(bailOutRecord->parent == nullptr);
    Assert(Js::VarIs<Js::ScriptFunction>(layout->functionObject));
    Js::ScriptFunction ** functionRef = (Js::ScriptFunction **)&layout->functionObject;
    Js::ArgumentReader args(&layout->callInfo, layout->args);
    Js::Var result = BailOutHelper(layout, functionRef, args, false, bailOutRecord, bailOutOffset, returnAddress, bailOutKind, registerSaves, bailOutReturnValue, layout->GetArgumentsObjectLocation(), branchValue, argoutRestoreAddress);
    return result;
}